

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::LoadLWO2VertexMap(LWOImporter *this,uint length,bool perPoly)

{
  ulong *puVar1;
  pointer *ppaVar2;
  pointer *ppfVar3;
  byte bVar4;
  ushort uVar5;
  uint8_t *puVar6;
  iterator __position;
  pointer pVVar7;
  iterator iVar8;
  pointer pUVar9;
  pointer pWVar10;
  Layer *pLVar11;
  bool bVar12;
  float fVar13;
  bool bVar14;
  int iVar15;
  byte *pbVar16;
  long *plVar17;
  undefined8 *puVar18;
  uint *puVar19;
  ulong uVar20;
  float *pfVar21;
  Logger *pLVar22;
  runtime_error *this_00;
  byte bVar23;
  uint uVar24;
  long *plVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  byte *pbVar29;
  aiVector3t<float> *__args;
  ushort uVar30;
  LWOImporter *this_01;
  long lVar31;
  VColorChannel *elem;
  pointer pVVar32;
  pointer pUVar33;
  pointer pWVar34;
  Layer *this_02;
  uint uVar35;
  ReferrerList *this_03;
  pointer pFVar36;
  string name;
  ulong local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  LWOImporter *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  VMapEntry *local_208;
  uint *local_200;
  ulong local_1f8;
  pointer local_1f0;
  ulong local_1e8;
  uint local_1dc;
  ReferrerList *local_1d8;
  Layer *local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [376];
  
  if (length < 6) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"LWO: VMAP chunk is too small","");
    std::runtime_error::runtime_error(this_00,(string *)local_1a8);
    *(undefined ***)this_00 = &PTR__runtime_error_00900168;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_200 = (uint *)this->mFileBuffer;
  uVar27 = *local_200;
  this->mFileBuffer = (uint8_t *)(local_200 + 1);
  uVar5 = (ushort)local_200[1];
  pbVar29 = (byte *)((long)local_200 + 6);
  this->mFileBuffer = pbVar29;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  if (*(byte *)((long)local_200 + 6) != 0) {
    pbVar16 = (byte *)((long)local_200 + 7);
    uVar24 = 1;
    do {
      if (length < uVar24) {
        pLVar22 = DefaultLogger::get();
        Logger::warn(pLVar22,"LWO: Invalid file, string is is too long");
        break;
      }
      this->mFileBuffer = pbVar16;
      uVar24 = uVar24 + 1;
      bVar23 = *pbVar16;
      pbVar16 = pbVar16 + 1;
    } while (bVar23 != 0);
  }
  puVar6 = this->mFileBuffer;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pbVar29,puVar6);
  uVar24 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 | uVar27 << 0x18;
  uVar30 = uVar5 << 8 | uVar5 >> 8;
  local_230 = this;
  std::__cxx11::string::operator=((string *)&local_228,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_);
  }
  this_01 = local_230;
  local_230->mFileBuffer = local_230->mFileBuffer + (2 - (ulong)((int)puVar6 - (int)pbVar29 & 1));
  if ((int)uVar24 < 0x52474220) {
    if ((int)uVar24 < 0x4e4f524d) {
      if (uVar24 == 0x4d4e5657) {
LAB_0042b363:
        if (uVar5 != 0x100) {
          pLVar22 = DefaultLogger::get();
          std::operator+(&local_250,"LWO2: Skipping Weight Channel \'",&local_228);
          puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
          local_1a8._0_8_ = local_1a8 + 0x10;
          plVar17 = puVar18 + 2;
          if ((long *)*puVar18 == plVar17) {
            local_1a8._16_8_ = *plVar17;
            local_1a8._24_8_ = puVar18[3];
          }
          else {
            local_1a8._16_8_ = *plVar17;
            local_1a8._0_8_ = (long *)*puVar18;
          }
          local_1a8._8_8_ = puVar18[1];
          *puVar18 = plVar17;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          Logger::warn(pLVar22,(char *)local_1a8._0_8_);
          goto LAB_0042bfd0;
        }
        lVar31 = 0x48;
        if (uVar27 == 0x54484757) {
          lVar31 = 0x30;
        }
        local_208 = FindEntry<Assimp::LWO::WeightChannel>
                              ((vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                *)((long)&(local_230->mCurLayer->mTempPoints).
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar31),
                               &local_228,perPoly);
LAB_0042b4d6:
        (*local_208->_vptr_VMapEntry[2])
                  (local_208,
                   (ulong)(uint)((int)((ulong)((long)(this_01->mCurLayer->mTempPoints).
                                                                                                          
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this_01->mCurLayer->mTempPoints).
                                                                                                        
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                -0x55555555));
        local_200 = (uint *)((long)local_200 + (ulong)length);
        uVar27 = local_208->dims;
        if ((uint)uVar30 <= local_208->dims) {
          uVar27 = (uint)uVar30;
        }
        uVar28 = (ulong)uVar27;
        puVar19 = (uint *)this_01->mFileBuffer;
        local_1f8 = uVar28;
        if (puVar19 < local_200) {
          this_02 = this_01->mCurLayer;
          this_03 = &this_02->mPointReferrers;
          local_1dc = (int)((ulong)((long)(this_02->mTempPoints).
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_02->mTempPoints).
                                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x55555555;
          local_1c0 = (ulong)((long)(this_02->mFaces).
                                    super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_02->mFaces).
                                   super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5;
          local_1b8 = (ulong)((uVar30 - uVar27) * 4);
          local_1b0 = (ulong)(uVar27 * 4);
          local_1e8 = uVar28;
          local_1d8 = this_03;
          local_1d0 = this_02;
          do {
            uVar27 = *puVar19;
            pbVar29 = (byte *)((long)puVar19 + 1);
            this_01->mFileBuffer = pbVar29;
            if ((byte)uVar27 == 0xff) {
              bVar23 = *(byte *)((long)puVar19 + 1);
              this_01->mFileBuffer = (byte *)((long)puVar19 + 2);
              bVar4 = *(byte *)((long)puVar19 + 2);
              pbVar29 = (byte *)((long)puVar19 + 3);
              this_01->mFileBuffer = pbVar29;
              uVar27 = (uint)bVar4 << 8 | (uint)bVar23 << 0x10;
              lVar31 = 4;
            }
            else {
              uVar27 = (uint)(byte)uVar27 << 8;
              lVar31 = 2;
            }
            bVar23 = *pbVar29;
            this_01->mFileBuffer = (byte *)((long)puVar19 + lVar31);
            uVar27 = (bVar23 | uVar27) + this_01->mCurLayer->mPointIDXOfs;
            local_258 = (ulong)uVar27;
            if (uVar27 < local_1dc) {
              if (perPoly) {
                pbVar16 = this_01->mFileBuffer;
                bVar23 = *pbVar16;
                pbVar29 = pbVar16 + 1;
                this_01->mFileBuffer = pbVar29;
                if (bVar23 == 0xff) {
                  bVar23 = pbVar16[1];
                  this_01->mFileBuffer = pbVar16 + 2;
                  bVar4 = pbVar16[2];
                  pbVar29 = pbVar16 + 3;
                  this_01->mFileBuffer = pbVar29;
                  uVar24 = (uint)bVar4 << 8 | (uint)bVar23 << 0x10;
                  lVar31 = 4;
                }
                else {
                  uVar24 = (uint)bVar23 << 8;
                  lVar31 = 2;
                }
                bVar23 = *pbVar29;
                this_01->mFileBuffer = pbVar16 + lVar31;
                bVar12 = true;
                if (((local_208->abAssigned).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar27 >> 6] >>
                     (local_258 & 0x3f) & 1) != 0) {
                  uVar24 = (uVar24 | bVar23) + this_01->mCurLayer->mFaceIDXOfs;
                  if (uVar24 < (uint)local_1c0) {
                    pFVar36 = (this_02->mFaces).
                              super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (pFVar36[uVar24].super_aiFace.mNumIndices == 0) {
                      bVar14 = false;
                      local_258._0_4_ = uVar27;
                    }
                    else {
                      pFVar36 = pFVar36 + uVar24;
                      uVar26 = 0;
                      bVar14 = false;
                      local_1f0 = pFVar36;
                      do {
                        uVar27 = (pFVar36->super_aiFace).mIndices[uVar26];
                        uVar20 = local_258;
                        do {
                          uVar24 = (uint)uVar20;
                          if (uVar24 == uVar27) goto LAB_0042b7d8;
                          uVar24 = (this_03->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[uVar20];
                          uVar20 = (ulong)uVar24;
                        } while (uVar24 != 0xffffffff);
                        uVar24 = 0xffffffff;
LAB_0042b7d8:
                        local_1c8 = uVar26;
                        if (uVar24 != 0xffffffff) {
                          local_1a8._0_4_ = 0xffffffff;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                                    (this_03,((long)(this_02->mPointReferrers).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this_02->mPointReferrers).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2) +
                                             1,(value_type_conflict4 *)local_1a8);
                          uVar24 = (int)((ulong)((long)(this_02->mTempPoints).
                                                                                                              
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this_02->mTempPoints).
                                                                                                            
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                   -0x55555555;
                          local_258 = (ulong)uVar24;
                          (pFVar36->super_aiFace).mIndices[local_1c8] = uVar24;
                          AddToSingleLinkedList
                                    (this_03,uVar27,(pFVar36->super_aiFace).mIndices[local_1c8]);
                          __args = (this_02->mTempPoints).
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar27;
                          __position._M_current =
                               (this_02->mTempPoints).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              (this_02->mTempPoints).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                            _M_realloc_insert<aiVector3t<float>const&>
                                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>
                                        *)this_02,__position,__args);
                          }
                          else {
                            (__position._M_current)->z = __args->z;
                            fVar13 = __args->y;
                            (__position._M_current)->x = __args->x;
                            (__position._M_current)->y = fVar13;
                            ppaVar2 = &(this_02->mTempPoints).
                                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                            *ppaVar2 = *ppaVar2 + 1;
                          }
                          pVVar32 = (this_01->mCurLayer->mVColorChannels).
                                    super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pVVar7 = (this_01->mCurLayer->mVColorChannels).
                                   super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          bVar23 = (byte)uVar27;
                          if (pVVar32 != pVVar7) {
                            do {
                              if ((pVVar32->super_VMapEntry).name._M_string_length != 0) {
                                puVar1 = (pVVar32->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar27 >> 6);
                                *puVar1 = *puVar1 | 1L << (bVar23 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pVVar32->super_VMapEntry).abAssigned,
                                           (ulong)(pVVar32->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pVVar32->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pVVar32->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar24 = (pVVar32->super_VMapEntry).dims;
                                if (uVar24 != 0) {
                                  uVar35 = 0;
                                  do {
                                    pfVar21 = (pVVar32->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar27 * uVar24 + uVar35);
                                    iVar8._M_current =
                                         (pVVar32->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pVVar32->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pVVar32->super_VMapEntry).rawData,iVar8,pfVar21);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar21;
                                      ppfVar3 = &(pVVar32->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar3 = *ppfVar3 + 1;
                                    }
                                    uVar35 = uVar35 + 1;
                                    uVar24 = (pVVar32->super_VMapEntry).dims;
                                  } while (uVar35 < uVar24);
                                }
                              }
                              pVVar32 = pVVar32 + 1;
                            } while (pVVar32 != pVVar7);
                          }
                          pUVar33 = (local_230->mCurLayer->mUVChannels).
                                    super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pUVar9 = (local_230->mCurLayer->mUVChannels).
                                   super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          if (pUVar33 != pUVar9) {
                            do {
                              if ((pUVar33->super_VMapEntry).name._M_string_length != 0) {
                                puVar1 = (pUVar33->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar27 >> 6);
                                *puVar1 = *puVar1 | 1L << (bVar23 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pUVar33->super_VMapEntry).abAssigned,
                                           (ulong)(pUVar33->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pUVar33->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pUVar33->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar24 = (pUVar33->super_VMapEntry).dims;
                                if (uVar24 != 0) {
                                  uVar35 = 0;
                                  do {
                                    pfVar21 = (pUVar33->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar27 * uVar24 + uVar35);
                                    iVar8._M_current =
                                         (pUVar33->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pUVar33->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pUVar33->super_VMapEntry).rawData,iVar8,pfVar21);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar21;
                                      ppfVar3 = &(pUVar33->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar3 = *ppfVar3 + 1;
                                    }
                                    uVar35 = uVar35 + 1;
                                    uVar24 = (pUVar33->super_VMapEntry).dims;
                                  } while (uVar35 < uVar24);
                                }
                              }
                              pUVar33 = pUVar33 + 1;
                            } while (pUVar33 != pUVar9);
                          }
                          pWVar34 = (local_230->mCurLayer->mWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pWVar10 = (local_230->mCurLayer->mWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                          if (pWVar34 != pWVar10) {
                            do {
                              if ((pWVar34->super_VMapEntry).name._M_string_length != 0) {
                                puVar1 = (pWVar34->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar27 >> 6);
                                *puVar1 = *puVar1 | 1L << (bVar23 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pWVar34->super_VMapEntry).abAssigned,
                                           (ulong)(pWVar34->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pWVar34->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pWVar34->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar24 = (pWVar34->super_VMapEntry).dims;
                                if (uVar24 != 0) {
                                  uVar35 = 0;
                                  do {
                                    pfVar21 = (pWVar34->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar27 * uVar24 + uVar35);
                                    iVar8._M_current =
                                         (pWVar34->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pWVar34->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pWVar34->super_VMapEntry).rawData,iVar8,pfVar21);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar21;
                                      ppfVar3 = &(pWVar34->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar3 = *ppfVar3 + 1;
                                    }
                                    uVar35 = uVar35 + 1;
                                    uVar24 = (pWVar34->super_VMapEntry).dims;
                                  } while (uVar35 < uVar24);
                                }
                              }
                              pWVar34 = pWVar34 + 1;
                            } while (pWVar34 != pWVar10);
                          }
                          pWVar34 = (local_230->mCurLayer->mSWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pWVar10 = (local_230->mCurLayer->mSWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                          if (pWVar34 != pWVar10) {
                            do {
                              if ((pWVar34->super_VMapEntry).name._M_string_length != 0) {
                                puVar1 = (pWVar34->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar27 >> 6);
                                *puVar1 = *puVar1 | 1L << (bVar23 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pWVar34->super_VMapEntry).abAssigned,
                                           (ulong)(pWVar34->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pWVar34->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pWVar34->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar24 = (pWVar34->super_VMapEntry).dims;
                                if (uVar24 != 0) {
                                  uVar35 = 0;
                                  do {
                                    pfVar21 = (pWVar34->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar27 * uVar24 + uVar35);
                                    iVar8._M_current =
                                         (pWVar34->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pWVar34->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pWVar34->super_VMapEntry).rawData,iVar8,pfVar21);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar21;
                                      ppfVar3 = &(pWVar34->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar3 = *ppfVar3 + 1;
                                    }
                                    uVar35 = uVar35 + 1;
                                    uVar24 = (pWVar34->super_VMapEntry).dims;
                                  } while (uVar35 < uVar24);
                                }
                              }
                              pWVar34 = pWVar34 + 1;
                            } while (pWVar34 != pWVar10);
                          }
                          this_01 = local_230;
                          pLVar11 = local_230->mCurLayer;
                          bVar14 = true;
                          uVar28 = local_1e8;
                          this_02 = local_1d0;
                          this_03 = local_1d8;
                          pFVar36 = local_1f0;
                          if ((pLVar11->mNormals).super_VMapEntry.name._M_string_length != 0) {
                            puVar1 = (pLVar11->mNormals).super_VMapEntry.abAssigned.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     + (uVar27 >> 6);
                            *puVar1 = *puVar1 | 1L << (bVar23 & 0x3f);
                            std::vector<bool,_std::allocator<bool>_>::resize
                                      (&(pLVar11->mNormals).super_VMapEntry.abAssigned,
                                       (ulong)(pLVar11->mNormals).super_VMapEntry.abAssigned.
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base._M_offset +
                                       ((long)(pLVar11->mNormals).super_VMapEntry.abAssigned.
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base._M_p -
                                       (long)(pLVar11->mNormals).super_VMapEntry.abAssigned.
                                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                                             super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_p) * 8 + 1,false);
                            this_02 = local_1d0;
                            this_03 = local_1d8;
                            uVar24 = (pLVar11->mNormals).super_VMapEntry.dims;
                            uVar28 = local_1e8;
                            pFVar36 = local_1f0;
                            if (uVar24 != 0) {
                              uVar35 = 0;
                              do {
                                pfVar21 = (pLVar11->mNormals).super_VMapEntry.rawData.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start +
                                          (uVar27 * uVar24 + uVar35);
                                iVar8._M_current =
                                     (pLVar11->mNormals).super_VMapEntry.rawData.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                                if (iVar8._M_current ==
                                    (pLVar11->mNormals).super_VMapEntry.rawData.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<float,std::allocator<float>>::
                                  _M_realloc_insert<float_const&>
                                            ((vector<float,std::allocator<float>> *)
                                             &(pLVar11->mNormals).super_VMapEntry.rawData,iVar8,
                                             pfVar21);
                                }
                                else {
                                  *iVar8._M_current = *pfVar21;
                                  ppfVar3 = &(pLVar11->mNormals).super_VMapEntry.rawData.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_finish;
                                  *ppfVar3 = *ppfVar3 + 1;
                                }
                                uVar35 = uVar35 + 1;
                                uVar24 = (pLVar11->mNormals).super_VMapEntry.dims;
                                uVar28 = local_1e8;
                                this_01 = local_230;
                                pFVar36 = local_1f0;
                              } while (uVar35 < uVar24);
                            }
                          }
                        }
                        uVar26 = local_1c8 + 1;
                      } while (uVar26 < (pFVar36->super_aiFace).mNumIndices);
                    }
                    bVar12 = true;
                    uVar27 = (uint)local_258;
                    if (!bVar14) {
                      pLVar22 = DefaultLogger::get();
                      Formatter::
                      basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                      basic_formatter<char[38]>
                                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8,
                                 (char (*) [38])"LWO2: Failure evaluating VMAD entry \'");
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                                 local_228._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "\', vertex index wasn\'t found in that polygon",0x2c);
                      std::__cxx11::stringbuf::str();
                      Logger::warn(pLVar22,&local_250);
                      std::__cxx11::string::~string((string *)&local_250);
                      Formatter::
                      basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                      ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a8);
                      __assert_fail("had",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOLoader.cpp"
                                    ,0x467,
                                    "void Assimp::LWOImporter::LoadLWO2VertexMap(unsigned int, bool)"
                                   );
                    }
                  }
                  else {
                    pLVar22 = DefaultLogger::get();
                    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::basic_formatter<char[38]>
                              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                *)local_1a8,(char (*) [38])"LWO2: Failure evaluating VMAD entry \'")
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                               local_228._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\', polygon index is out of range",0x20);
                    std::__cxx11::stringbuf::str();
                    Logger::warn(pLVar22,local_250._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_250._M_dataplus._M_p != &local_250.field_2) {
                      operator_delete(local_250._M_dataplus._M_p);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                    this_01->mFileBuffer = this_01->mFileBuffer + (local_208->dims << 2);
                    bVar12 = false;
                  }
                }
                local_258._0_4_ = uVar27;
                uVar27 = (uint)local_258;
                if (!bVar12) goto LAB_0042be07;
              }
              local_258._0_4_ = uVar27;
              pfVar21 = (float *)operator_new__(local_1b0);
              if ((uint)local_1f8 != 0) {
                uVar26 = 0;
                puVar19 = (uint *)this_01->mFileBuffer;
                do {
                  uVar27 = *puVar19;
                  this_01->mFileBuffer = (uint8_t *)(puVar19 + 1);
                  pfVar21[uVar26] =
                       (float)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                              uVar27 << 0x18);
                  uVar26 = uVar26 + 1;
                  puVar19 = puVar19 + 1;
                } while (uVar28 != uVar26);
              }
              DoRecursiveVMAPAssignment(this_01,local_208,(uint)local_1f8,(uint)local_258,pfVar21);
              this_01->mFileBuffer = this_01->mFileBuffer + local_1b8;
              operator_delete__(pfVar21);
            }
            else {
              pLVar22 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[43]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,(char (*) [43])"LWO2: Failure evaluating VMAP/VMAD entry \'");
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"\', vertex index is out of range",0x1f);
              std::__cxx11::stringbuf::str();
              Logger::warn(pLVar22,local_250._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              this_01->mFileBuffer = this_01->mFileBuffer + (local_208->dims << 2);
            }
LAB_0042be07:
            puVar19 = (uint *)this_01->mFileBuffer;
          } while (puVar19 < local_200);
        }
        goto LAB_0042bff5;
      }
      if (uVar24 == 0x4d4f5246) goto LAB_0042bff5;
    }
    else {
      if (uVar24 == 0x4e4f524d) {
        iVar15 = std::__cxx11::string::compare((char *)&local_228);
        if ((uVar5 != 0x300 || iVar15 != 0) ||
           ((this_01->mCurLayer->mNormals).super_VMapEntry.name._M_string_length != 0))
        goto LAB_0042bff5;
        pLVar22 = DefaultLogger::get();
        Logger::info(pLVar22,"Processing non-standard extension: MODO VMAP.NORM.vert_normals");
        std::__cxx11::string::_M_assign
                  ((string *)&(this_01->mCurLayer->mNormals).super_VMapEntry.name);
        local_208 = &(this_01->mCurLayer->mNormals).super_VMapEntry;
        goto LAB_0042b4d6;
      }
      if (uVar24 == 0x5049434b) goto LAB_0042bff5;
    }
  }
  else if ((int)uVar24 < 0x53504f54) {
    if ((uVar24 == 0x52474220) || (uVar24 == 0x52474241)) {
      if (uVar30 - 5 < 0xfffffffe) {
        pLVar22 = DefaultLogger::get();
        std::operator+(&local_250,"LWO2: Skipping Color Map \'",&local_228);
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_1a8._0_8_ = local_1a8 + 0x10;
        plVar25 = plVar17 + 2;
        if ((long *)*plVar17 == plVar25) {
          local_1a8._16_8_ = *plVar25;
          local_1a8._24_8_ = plVar17[3];
        }
        else {
          local_1a8._16_8_ = *plVar25;
          local_1a8._0_8_ = (long *)*plVar17;
        }
        local_1a8._8_8_ = plVar17[1];
        *plVar17 = (long)plVar25;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        Logger::warn(pLVar22,(char *)local_1a8._0_8_);
LAB_0042bfd0:
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        goto LAB_0042bff5;
      }
      local_208 = FindEntry<Assimp::LWO::VColorChannel>
                            (&local_230->mCurLayer->mVColorChannels,&local_228,perPoly);
      goto LAB_0042b4d6;
    }
  }
  else {
    if (uVar24 == 0x53504f54) goto LAB_0042bff5;
    if (uVar24 == 0x54585556) {
      if (uVar5 != 0x200) {
        pLVar22 = DefaultLogger::get();
        std::operator+(&local_250,"LWO2: Skipping UV channel \'",&local_228);
        puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
        local_1a8._0_8_ = local_1a8 + 0x10;
        plVar17 = puVar18 + 2;
        if ((long *)*puVar18 == plVar17) {
          local_1a8._16_8_ = *plVar17;
          local_1a8._24_8_ = puVar18[3];
        }
        else {
          local_1a8._16_8_ = *plVar17;
          local_1a8._0_8_ = (long *)*puVar18;
        }
        local_1a8._8_8_ = puVar18[1];
        *puVar18 = plVar17;
        puVar18[1] = 0;
        *(undefined1 *)(puVar18 + 2) = 0;
        Logger::warn(pLVar22,(char *)local_1a8._0_8_);
        goto LAB_0042bfd0;
      }
      local_208 = FindEntry<Assimp::LWO::UVChannel>
                            (&local_230->mCurLayer->mUVChannels,&local_228,perPoly);
      goto LAB_0042b4d6;
    }
    if (uVar24 == 0x57474854) goto LAB_0042b363;
  }
  std::__cxx11::string::compare((char *)&local_228);
  pLVar22 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[43]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [43])"LWO2: Skipping unknown VMAP/VMAD channel \'");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
  std::__cxx11::stringbuf::str();
  Logger::warn(pLVar22,local_250._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
LAB_0042bff5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2VertexMap(unsigned int length, bool perPoly)
{
    LE_NCONST uint8_t* const end = mFileBuffer+length;

    AI_LWO_VALIDATE_CHUNK_LENGTH(length,VMAP,6);
    unsigned int type = GetU4();
    unsigned int dims = GetU2();

    VMapEntry* base;

    // read the name of the vertex map
    std::string name;
    GetS0(name,length);

    switch (type)
    {
    case AI_LWO_TXUV:
        if (dims != 2)  {
            ASSIMP_LOG_WARN("LWO2: Skipping UV channel \'"
            + name + "\' with !2 components");
            return;
        }
        base = FindEntry(mCurLayer->mUVChannels,name,perPoly);
        break;
    case AI_LWO_WGHT:
    case AI_LWO_MNVW:
        if (dims != 1)  {
            ASSIMP_LOG_WARN("LWO2: Skipping Weight Channel \'"
            + name + "\' with !1 components");
            return;
        }
        base = FindEntry((type == AI_LWO_WGHT ? mCurLayer->mWeightChannels
            : mCurLayer->mSWeightChannels),name,perPoly);
        break;
    case AI_LWO_RGB:
    case AI_LWO_RGBA:
        if (dims != 3 && dims != 4) {
            ASSIMP_LOG_WARN("LWO2: Skipping Color Map \'"
            + name + "\' with a dimension > 4 or < 3");
            return;
        }
        base = FindEntry(mCurLayer->mVColorChannels,name,perPoly);
        break;

    case AI_LWO_MODO_NORM:
        /*  This is a non-standard extension chunk used by Luxology's MODO.
         *  It stores per-vertex normals. This VMAP exists just once, has
         *  3 dimensions and is btw extremely beautiful.
         */
        if (name != "vert_normals" || dims != 3 || mCurLayer->mNormals.name.length())
            return;

        ASSIMP_LOG_INFO("Processing non-standard extension: MODO VMAP.NORM.vert_normals");

        mCurLayer->mNormals.name = name;
        base = & mCurLayer->mNormals;
        break;

    case AI_LWO_PICK: /* these VMAPs are just silently dropped */
    case AI_LWO_MORF:
    case AI_LWO_SPOT:
        return;

    default:
        if (name == "APS.Level") {
            // XXX handle this (seems to be subdivision-related).
        }
        ASSIMP_LOG_WARN_F("LWO2: Skipping unknown VMAP/VMAD channel \'", name, "\'");
        return;
    };
    base->Allocate((unsigned int)mCurLayer->mTempPoints.size());

    // now read all entries in the map
    type = std::min(dims,base->dims);
    const unsigned int diff = (dims - type)<<2u;

    LWO::FaceList& list = mCurLayer->mFaces;
    LWO::PointList& pointList = mCurLayer->mTempPoints;
    LWO::ReferrerList& refList = mCurLayer->mPointReferrers;

    const unsigned int numPoints = (unsigned int)pointList.size();
    const unsigned int numFaces  = (unsigned int)list.size();

    while (mFileBuffer < end)   {

        unsigned int idx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mPointIDXOfs;
        if (idx >= numPoints)   {
            ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAP/VMAD entry \'", name, "\', vertex index is out of range");
            mFileBuffer += base->dims<<2u;
            continue;
        }
        if (perPoly)    {
            unsigned int polyIdx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mFaceIDXOfs;
            if (base->abAssigned[idx])  {
                // we have already a VMAP entry for this vertex - thus
                // we need to duplicate the corresponding polygon.
                if (polyIdx >= numFaces)    {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', polygon index is out of range");
                    mFileBuffer += base->dims<<2u;
                    continue;
                }

                LWO::Face& src = list[polyIdx];

                // generate a new unique vertex for the corresponding index - but only
                // if we can find the index in the face
                bool had = false;
                for (unsigned int i = 0; i < src.mNumIndices;++i)   {

                    unsigned int srcIdx = src.mIndices[i], tmp = idx;
                    do {
                        if (tmp == srcIdx)
                            break;
                    }
                    while ((tmp = refList[tmp]) != UINT_MAX);
                    if (tmp == UINT_MAX) {
                        continue;
                    }

                    had = true;
                    refList.resize(refList.size()+1, UINT_MAX);

                    idx = (unsigned int)pointList.size();
                    src.mIndices[i] = (unsigned int)pointList.size();

                    // store the index of the new vertex in the old vertex
                    // so we get a single linked list we can traverse in
                    // only one direction
                    AddToSingleLinkedList(refList,srcIdx,src.mIndices[i]);
                    pointList.push_back(pointList[srcIdx]);

                    CreateNewEntry(mCurLayer->mVColorChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mUVChannels,      srcIdx );
                    CreateNewEntry(mCurLayer->mWeightChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mSWeightChannels, srcIdx );
                    CreateNewEntry(mCurLayer->mNormals, srcIdx );
                }
                if (!had) {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', vertex index wasn't found in that polygon");
                    ai_assert(had);
                }
            }
        }

        std::unique_ptr<float[]> temp(new float[type]);
        for (unsigned int l = 0; l < type;++l)
            temp[l] = GetF4();

        DoRecursiveVMAPAssignment(base,type,idx, temp.get());
        mFileBuffer += diff;
    }
}